

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint addChunk_cLLi(ucvector *out,LodePNGInfo *info)

{
  uint uVar1;
  uint uVar2;
  uchar *in_RAX;
  uchar *chunk;
  uchar *local_18;
  
  local_18 = in_RAX;
  uVar2 = lodepng_chunk_init(&local_18,out,8,"cLLi");
  if (uVar2 == 0) {
    uVar1 = info->clli_max_cll;
    *(uint *)(local_18 + 8) =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = info->clli_max_fall;
    *(uint *)(local_18 + 0xc) =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    lodepng_chunk_generate_crc(local_18);
  }
  return uVar2;
}

Assistant:

static unsigned addChunk_cLLi(ucvector* out, const LodePNGInfo* info) {
  unsigned char* chunk;
  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 8, "cLLi"));
  lodepng_set32bitInt(chunk + 8 + 0, info->clli_max_cll);
  lodepng_set32bitInt(chunk + 8 + 4, info->clli_max_fall);
  lodepng_chunk_generate_crc(chunk);
  return 0;
}